

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O0

ColumnList * duckdb::ColumnList::Deserialize(Deserializer *deserializer)

{
  ColumnList *in_RDI;
  vector<duckdb::ColumnDefinition,_true> columns;
  ColumnList *result;
  bool in_stack_000000b7;
  vector<duckdb::ColumnDefinition,_true> *in_stack_000000b8;
  ColumnList *in_stack_000000c0;
  vector<duckdb::ColumnDefinition,_true> *this;
  char *in_stack_ffffffffffffffc8;
  field_id_t in_stack_ffffffffffffffd6;
  Deserializer *in_stack_ffffffffffffffd8;
  
  this = (vector<duckdb::ColumnDefinition,_true> *)&stack0xffffffffffffffd8;
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::ColumnDefinition,true>>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd6,in_stack_ffffffffffffffc8);
  vector<duckdb::ColumnDefinition,_true>::vector(this,&in_RDI->columns);
  ColumnList(in_stack_000000c0,in_stack_000000b8,in_stack_000000b7);
  vector<duckdb::ColumnDefinition,_true>::~vector
            ((vector<duckdb::ColumnDefinition,_true> *)0xada040);
  vector<duckdb::ColumnDefinition,_true>::~vector
            ((vector<duckdb::ColumnDefinition,_true> *)0xada086);
  return in_RDI;
}

Assistant:

ColumnList ColumnList::Deserialize(Deserializer &deserializer) {
	auto columns = deserializer.ReadPropertyWithDefault<vector<ColumnDefinition>>(100, "columns");
	ColumnList result(std::move(columns));
	return result;
}